

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

int __thiscall
ktx::ValidationContext::validate(ValidationContext *this,bool doCreateAndTranscodeChecks)

{
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  code *local_48;
  char *local_40;
  anon_class_8_1_8991fb9c call;
  
  local_48 = validateHeader;
  local_40 = (char *)0x0;
  name._M_str = "Header";
  name._M_len = 6;
  call.this = this;
  validate(bool)::$_0::operator()(&call,(offset_in_ValidationContext_to_subr *)&local_48,name);
  local_48 = validateIndices;
  local_40 = (char *)0x0;
  name_00._M_str = "Index";
  name_00._M_len = 5;
  validate(bool)::$_0::operator()(&call,(offset_in_ValidationContext_to_subr *)&local_48,name_00);
  local_48 = (code *)0xc;
  local_40 = "Expected DFD";
  calculateExpectedDFD(this,(this->header).vkFormat);
  local_48 = validateDFD;
  local_40 = (char *)0x0;
  name_01._M_str = "DFD";
  name_01._M_len = 3;
  validate(bool)::$_0::operator()(&call,(offset_in_ValidationContext_to_subr *)&local_48,name_01);
  local_48 = validateLevelIndex;
  local_40 = (char *)0x0;
  name_02._M_str = "Level Index";
  name_02._M_len = 0xb;
  validate(bool)::$_0::operator()(&call,(offset_in_ValidationContext_to_subr *)&local_48,name_02);
  local_48 = validateKVD;
  local_40 = (char *)0x0;
  name_03._M_str = "KVD";
  name_03._M_len = 3;
  validate(bool)::$_0::operator()(&call,(offset_in_ValidationContext_to_subr *)&local_48,name_03);
  local_48 = validateSGD;
  local_40 = (char *)0x0;
  name_04._M_str = "SGD";
  name_04._M_len = 3;
  validate(bool)::$_0::operator()(&call,(offset_in_ValidationContext_to_subr *)&local_48,name_04);
  local_48 = validatePaddings;
  local_40 = (char *)0x0;
  name_05._M_str = "padding";
  name_05._M_len = 7;
  validate(bool)::$_0::operator()(&call,(offset_in_ValidationContext_to_subr *)&local_48,name_05);
  if (doCreateAndTranscodeChecks) {
    local_48 = validateCreateAndTranscode;
    local_40 = (char *)0x0;
    name_06._M_str = "Create and Transcode";
    name_06._M_len = 0x14;
    validate(bool)::$_0::operator()(&call,(offset_in_ValidationContext_to_subr *)&local_48,name_06);
  }
  return this->returnCode;
}

Assistant:

int ValidationContext::validate(bool doCreateAndTranscodeChecks) {
    const auto call = [&](const auto& fn, std::string_view name, auto&&... args) {
        try {
            (this->*fn)(std::forward<decltype(args)>(args)...);
        } catch (const std::bad_alloc& ex) {
            error(System::OutOfMemory, name, ex.what());
        }
    };

    call(&ValidationContext::validateHeader, "Header");
    call(&ValidationContext::validateIndices, "Index");
    call(&ValidationContext::calculateExpectedDFD, "Expected DFD", VkFormat(header.vkFormat));
    call(&ValidationContext::validateDFD, "DFD");
    call(&ValidationContext::validateLevelIndex, "Level Index"); // Must come after the DFD parsed
    call(&ValidationContext::validateKVD, "KVD");
    call(&ValidationContext::validateSGD, "SGD");
    call(&ValidationContext::validatePaddings, "padding");
    if (doCreateAndTranscodeChecks)
        call(&ValidationContext::validateCreateAndTranscode, "Create and Transcode");

    return returnCode;
}